

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise_3x3_int8.h
# Opt level: O1

void ncnn::convdw3x3s2_int8_requant_sse
               (Mat *bottom_blob,Mat *top_blob,Mat *_kernel,Mat *_bias,
               vector<float,_std::allocator<float>_> *scales_requant,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  void *pvVar7;
  void *pvVar8;
  pointer pfVar9;
  float fVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  int iVar15;
  int iVar16;
  void *pvVar17;
  long lVar18;
  void *pvVar19;
  void *pvVar20;
  long lVar21;
  long lVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  undefined1 auVar26 [16];
  
  iVar3 = top_blob->c;
  if (0 < (long)iVar3) {
    iVar4 = top_blob->w;
    iVar5 = top_blob->h;
    pvVar7 = _kernel->data;
    pvVar8 = _bias->data;
    iVar6 = bottom_blob->w;
    lVar21 = (long)((iVar6 - iVar4) * 2);
    lVar13 = 0;
    auVar23._8_4_ = 0x80000000;
    auVar23._0_8_ = 0x8000000080000000;
    auVar23._12_4_ = 0x80000000;
    auVar24._8_4_ = 0x3effffff;
    auVar24._0_8_ = 0x3effffff3effffff;
    auVar24._12_4_ = 0x3effffff;
    do {
      if (pvVar8 == (void *)0x0) {
        fVar25 = 0.0;
      }
      else {
        fVar25 = *(float *)((long)pvVar8 + lVar13 * 4);
      }
      if (0 < iVar5) {
        pvVar19 = (void *)(top_blob->cstep * lVar13 * top_blob->elemsize + (long)top_blob->data);
        pfVar9 = (scales_requant->super__Vector_base<float,_std::allocator<float>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        fVar1 = pfVar9[lVar13 * 2];
        fVar2 = pfVar9[lVar13 * 2 + 1];
        pvVar20 = (void *)(bottom_blob->cstep * lVar13 * bottom_blob->elemsize +
                          (long)bottom_blob->data);
        lVar11 = lVar13 * 9;
        pvVar17 = (void *)((long)iVar6 * 2 + (long)pvVar20);
        lVar18 = (long)iVar6 + (long)pvVar20;
        iVar12 = 0;
        do {
          if (0 < iVar4) {
            lVar14 = 0;
            lVar22 = 0;
            iVar15 = iVar4 + 1;
            do {
              fVar10 = (fVar1 * (float)((int)*(char *)((long)pvVar7 + lVar11 + 8) *
                                        (int)*(char *)((long)pvVar17 + lVar14 * 2 + 2) +
                                        (int)*(char *)((long)pvVar7 + lVar11 + 7) *
                                        (int)*(char *)((long)pvVar17 + lVar14 * 2 + 1) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 6) *
                                       (int)*(char *)((long)pvVar17 + lVar14 * 2) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 5) *
                                       (int)*(char *)(lVar18 + 2 + lVar14 * 2) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 4) *
                                       (int)*(char *)(lVar18 + 1 + lVar14 * 2) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 3) *
                                       (int)*(char *)(lVar18 + lVar14 * 2) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 2) *
                                       (int)*(char *)((long)pvVar20 + lVar14 * 2 + 2) +
                                       (int)*(char *)((long)pvVar7 + lVar11 + 1) *
                                       (int)*(char *)((long)pvVar20 + lVar14 * 2 + 1) +
                                       (int)*(char *)((long)pvVar7 + lVar11) *
                                       (int)*(char *)((long)pvVar20 + lVar14 * 2)) + fVar25) * fVar2
              ;
              auVar26 = vandps_avx(ZEXT416((uint)fVar10),auVar23);
              auVar26 = vorps_avx(auVar26,auVar24);
              auVar26 = ZEXT416((uint)(fVar10 + auVar26._0_4_));
              auVar26 = vroundss_avx(auVar26,auVar26,0xb);
              iVar16 = (int)auVar26._0_4_;
              if (iVar16 < -0x7e) {
                iVar16 = -0x7f;
              }
              if (0x7e < iVar16) {
                iVar16 = 0x7f;
              }
              *(char *)((long)pvVar19 + lVar14) = (char)iVar16;
              iVar15 = iVar15 + -1;
              lVar22 = lVar22 + -2;
              lVar14 = lVar14 + 1;
            } while (1 < iVar15);
            pvVar17 = (void *)((long)pvVar17 - lVar22);
            lVar18 = lVar18 - lVar22;
            pvVar20 = (void *)((long)pvVar20 - lVar22);
            pvVar19 = (void *)((long)pvVar19 + lVar14);
          }
          pvVar20 = (void *)((long)pvVar20 + lVar21);
          lVar18 = lVar18 + lVar21;
          pvVar17 = (void *)((long)pvVar17 + lVar21);
          iVar12 = iVar12 + 1;
        } while (iVar12 != iVar5);
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar3);
  }
  return;
}

Assistant:

static void convdw3x3s2_int8_requant_sse(const Mat& bottom_blob, Mat& top_blob, const Mat& _kernel, const Mat& _bias, std::vector<float> scales_requant, const Option& opt)
{
    int w = bottom_blob.w;
    //int h = bottom_blob.h;
    //int inch = bottom_blob.c;

    int outw = top_blob.w;
    int outh = top_blob.h;
    int outch = top_blob.c;

    const int tailstep = w - 2 * outw + w;

    const signed char* kernel = _kernel;
    const float* bias = _bias;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int p = 0; p < outch; p++)
    {
        Mat out = top_blob.channel(p);
        signed char* outptr = out;

        const float bias0 = bias ? bias[p] : 0.f;
        const float scale_requant_in = scales_requant[2 * p];
        const float scale_requant_out = scales_requant[2 * p + 1];

        const signed char* kernel0 = (const signed char*)kernel + p * 9;

        const signed char* img0 = bottom_blob.channel(p);
        const signed char* r0 = img0;
        const signed char* r1 = img0 + w;
        const signed char* r2 = img0 + w * 2;

        int i = 0;

        for (; i < outh; i++)
        {
            int remain = outw;

            for (; remain > 0; remain--)
            {
                int sum = 0;

                sum += (int)r0[0] * (int)kernel0[0];
                sum += (int)r0[1] * (int)kernel0[1];
                sum += (int)r0[2] * (int)kernel0[2];
                sum += (int)r1[0] * (int)kernel0[3];
                sum += (int)r1[1] * (int)kernel0[4];
                sum += (int)r1[2] * (int)kernel0[5];
                sum += (int)r2[0] * (int)kernel0[6];
                sum += (int)r2[1] * (int)kernel0[7];
                sum += (int)r2[2] * (int)kernel0[8];

                *outptr = float2int8(((float)sum * scale_requant_in + bias0) * scale_requant_out);

                r0 += 2;
                r1 += 2;
                r2 += 2;
                outptr++;
            }

            r0 += tailstep;
            r1 += tailstep;
            r2 += tailstep;
        }
    }
}